

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

void slang::ast::Expression::findPotentiallyImplicitNets
               (SyntaxNode *expr,ASTContext *context,
               SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *results)

{
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *in_RDX;
  ASTContext *in_RSI;
  Visitor visitor;
  Visitor *in_stack_ffffffffffffffd8;
  SyntaxNode *in_stack_ffffffffffffffe0;
  
  findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::
  SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor::Visitor(slang::ast::
  ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const_>__
            (&stack0xffffffffffffffd8,in_RSI,in_RDX);
  slang::syntax::SyntaxNode::
  visit<slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Expression::findPotentiallyImplicitNets(
    const SyntaxNode& expr, const ASTContext& context,
    SmallVectorBase<const IdentifierNameSyntax*>& results) {

    struct Visitor : public SyntaxVisitor<Visitor> {
        Visitor(const ASTContext& context, SmallVectorBase<const IdentifierNameSyntax*>& results) :
            context(context), results(results) {}

        void handle(const NameSyntax& nameSyntax) {
            if (nameSyntax.kind != SyntaxKind::IdentifierName)
                return;

            bitmask<LookupFlags> flags = LookupFlags::NoUndeclaredError;
            if (context.flags.has(ASTFlags::BindInstantiation))
                flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

            LookupResult result;
            ASTContext ctx(*context.scope, LookupLocation::max);
            Lookup::name(nameSyntax, ctx, flags, result);

            SLANG_ASSERT(!result.flags.has(LookupResultFlags::IsHierarchical));

            if (!result.found && !result.hasError())
                results.push_back(&nameSyntax.as<IdentifierNameSyntax>());
        }

        const ASTContext& context;
        SmallVectorBase<const IdentifierNameSyntax*>& results;
    };

    Visitor visitor(context, results);
    expr.visit(visitor);
}